

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void listener_start_pipe(nni_listener *l,nni_pipe *p)

{
  nni_sock *s_00;
  _Bool _Var1;
  int iVar2;
  nng_log_level nVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  char local_b8 [8];
  char addr [144];
  nni_sock *s;
  nni_pipe *p_local;
  nni_listener *l_local;
  
  s_00 = l->l_sock;
  nni_stat_inc(&l->st_pipes,1);
  nni_stat_inc(&s_00->st_pipes,1);
  nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
  _Var1 = nni_pipe_is_closed(p);
  if (_Var1) {
    nni_stat_inc(&l->st_reject,1);
    nni_stat_inc(&s_00->st_rejects,1);
    nni_pipe_rele(p);
  }
  else {
    iVar2 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar2 == 0) {
      nni_stat_set_id(&p->st_root,p->p_id);
      nni_stat_set_id(&p->st_id,p->p_id);
      nni_stat_register(&p->st_root);
      nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
      nVar3 = nng_log_get_level();
      if (NNG_LOG_INFO < nVar3) {
        uVar4 = nni_pipe_id(p);
        uVar5 = nni_sock_id(s_00);
        pcVar6 = nni_pipe_peer_addr(p,local_b8);
        nng_log_debug("NNG-ACCEPT","Accepted pipe<%u> on socket<%u> from %s",(ulong)uVar4,
                      (ulong)uVar5,pcVar6);
      }
      nni_pipe_rele(p);
    }
    else {
      nni_stat_inc(&l->st_reject,1);
      nni_stat_inc(&s_00->st_rejects,1);
      nni_pipe_close(p);
      nni_pipe_rele(p);
    }
  }
  return;
}

Assistant:

static void
listener_start_pipe(nni_listener *l, nni_pipe *p)
{
	nni_sock *s = l->l_sock;

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&l->st_pipes, 1);
	nni_stat_inc(&s->st_pipes, 1);
#endif

	nni_pipe_run_cb(p, NNG_PIPE_EV_ADD_PRE);

	if (nni_pipe_is_closed(p)) {
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&l->st_reject, 1);
		nni_stat_inc(&s->st_rejects, 1);
#endif
		nni_pipe_rele(p);
		return;
	}
	if (p->p_proto_ops.pipe_start(p->p_proto_data) != 0) {
#ifdef NNG_ENABLE_STATS
		nni_stat_inc(&l->st_reject, 1);
		nni_stat_inc(&s->st_rejects, 1);
#endif
		nni_pipe_close(p);
		nni_pipe_rele(p);
		return;
	}
#ifdef NNG_ENABLE_STATS
	nni_stat_set_id(&p->st_root, (int) p->p_id);
	nni_stat_set_id(&p->st_id, (int) p->p_id);
	nni_stat_register(&p->st_root);
#endif
	nni_pipe_run_cb(p, NNG_PIPE_EV_ADD_POST);
	if (nng_log_get_level() >= NNG_LOG_DEBUG) {
		char addr[NNG_MAXADDRSTRLEN];
		nng_log_debug("NNG-ACCEPT",
		    "Accepted pipe<%u> on socket<%u> from %s", nni_pipe_id(p),
		    nni_sock_id(s), nni_pipe_peer_addr(p, addr));
	}

	// the socket now "owns" the pipe, and a pipe close should immediately
	// start the process of teardown.
	nni_pipe_rele(p);
}